

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCasts.hpp
# Opt level: O2

DOMNodeImpl * xercesc_4_0::castToNodeImpl(DOMNode *p)

{
  long *plVar1;
  long lVar2;
  DOMNodeImpl *pDVar3;
  DOMException *this;
  
  plVar1 = (long *)__dynamic_cast(p,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,0xfffffffffffffffe)
  ;
  if (plVar1 != (long *)0x0) {
    lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
    if (lVar2 != 0) {
      pDVar3 = (DOMNodeImpl *)(**(code **)(*plVar1 + 0x10))(plVar1);
      return pDVar3;
    }
  }
  this = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

static inline DOMNodeImpl *castToNodeImpl(DOMNode *p)
{
    HasDOMNodeImpl *pE = dynamic_cast<HasDOMNodeImpl*>(p);
    if (!pE || !pE->getNodeImpl()) {
        throw DOMException(DOMException::INVALID_STATE_ERR, 0, XMLPlatformUtils::fgMemoryManager);
    }
    return pE->getNodeImpl();
}